

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  size_t sVar1;
  int iVar2;
  C *pCVar3;
  size_t length;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char local_40;
  
  local_58 = *(undefined8 *)va;
  uStack_50 = *(undefined8 *)&va->field_0x8;
  local_48 = *(undefined8 *)&va->field_0x10;
  local_40 = '\x01';
  iVar2 = vsnprintf((char *)0x0,0,formatString,&local_58);
  if (local_40 == '\x01') {
    local_40 = '\0';
  }
  sVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  length = sVar1 + (long)iVar2;
  pCVar3 = createBuffer(this,length,true);
  if (pCVar3 == (C *)0x0) {
    length = 0xffffffffffffffff;
  }
  else {
    local_78 = *(undefined8 *)va;
    uStack_70 = *(undefined8 *)&va->field_0x8;
    local_68 = *(undefined8 *)&va->field_0x10;
    local_60 = 1;
    vsnprintf((this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p + sVar1,
              (long)iVar2 + 1,formatString,&local_78);
  }
  return length;
}

Assistant:

size_t
	appendFormat_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t appendLength = Details::calcFormatLength_va(formatString, va);
		size_t oldLength = this->m_length;
		size_t newLength = oldLength + appendLength;
		if (!createBuffer(newLength, true))
			return -1;

		Details::format_va(this->m_p + oldLength, appendLength + 1, formatString, va);
		return newLength;
	}